

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  char *pcVar5;
  Ch *pCVar6;
  Number NVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar15;
  byte *pbVar16;
  undefined4 uVar17;
  char *pcVar18;
  byte bVar19;
  uint16_t uVar20;
  uint uVar21;
  ulong uVar22;
  SizeType SVar23;
  byte *pbVar24;
  ushort uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uStack_48;
  uint uStack_44;
  
  bVar2 = *is->src_;
  if (bVar2 < 0x6e) {
    if (bVar2 == 0x22) {
      ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar2 != 0x5b) {
      if (bVar2 != 0x66) {
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar5 = is->src_;
      if (*pcVar5 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x371,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pcVar18 = pcVar5 + 1;
      is->src_ = pcVar18;
      if (pcVar5[1] == 'a') {
        pcVar18 = pcVar5 + 2;
        is->src_ = pcVar18;
        if (pcVar5[2] == 'l') {
          pcVar18 = pcVar5 + 3;
          is->src_ = pcVar18;
          if (pcVar5[3] == 's') {
            pcVar18 = pcVar5 + 4;
            is->src_ = pcVar18;
            if (pcVar5[4] == 'e') {
              is->src_ = pcVar5 + 5;
              pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
                        Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                                  (&handler->stack_,1);
              (pGVar15->data_).n = (Number)0x0;
              (pGVar15->data_).s.str = (Ch *)0x0;
              (pGVar15->data_).f.flags = 9;
              return;
            }
          }
        }
      }
      if (*(int *)(this + 0x30) == 0) {
        pCVar6 = is->head_;
        *(undefined4 *)(this + 0x30) = 3;
        *(long *)(this + 0x38) = (long)pcVar18 - (long)pCVar6;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x379,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x327,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar15->data_).n = (Number)0x0;
    (pGVar15->data_).s.str = (Ch *)0x0;
    (pGVar15->data_).f.flags = 4;
    pbVar16 = (byte *)is->src_;
    while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))) {
      pbVar16 = pbVar16 + 1;
    }
    is->src_ = (Ch *)pbVar16;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar16 == 0x5d) {
        is->src_ = (Ch *)(pbVar16 + 1);
        bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (!bVar11) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                          ,0x332,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
LAB_0011ac14:
          pbVar16 = (byte *)is->src_;
          uVar17 = 0x10;
LAB_0011ac1c:
          pCVar6 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar17;
          *(long *)(this + 0x38) = (long)pbVar16 - (long)pCVar6;
        }
      }
      else {
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) == 0) {
          SVar23 = 0;
          do {
            pbVar16 = (byte *)is->src_;
            while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
                  ) {
              pbVar16 = pbVar16 + 1;
            }
            SVar23 = SVar23 + 1;
            is->src_ = (Ch *)pbVar16;
            if (*pbVar16 != 0x2c) {
              if (*pbVar16 != 0x5d) {
                uVar17 = 7;
                goto LAB_0011ac1c;
              }
              is->src_ = (Ch *)(pbVar16 + 1);
              bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndArray(handler,SVar23);
              if (bVar11) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                              ,0x344,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_0011ac14;
            }
            pbVar16 = pbVar16 + 1;
            is->src_ = (Ch *)pbVar16;
            while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
                  ) {
              pbVar16 = pbVar16 + 1;
            }
            is->src_ = (Ch *)pbVar16;
            ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
          } while (*(int *)(this + 0x30) == 0);
        }
      }
    }
    return;
  }
  if (bVar2 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar15->data_).n = (Number)0x0;
    (pGVar15->data_).s.str = (Ch *)0x0;
    (pGVar15->data_).f.flags = 3;
    pbVar16 = (byte *)is->src_;
    while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))) {
      pbVar16 = pbVar16 + 1;
    }
    is->src_ = (Ch *)pbVar16;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar16 == 0x7d) {
        is->src_ = (Ch *)(pbVar16 + 1);
        bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar11) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x2ee,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_0011aa6d:
        pbVar16 = (byte *)is->src_;
        uVar17 = 0x10;
      }
      else {
        if (*pbVar16 == 0x22) {
          SVar23 = 0;
          do {
            ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar16 = (byte *)is->src_;
            while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
                  ) {
              pbVar16 = pbVar16 + 1;
            }
            is->src_ = (Ch *)pbVar16;
            if (*pbVar16 != 0x3a) {
              uVar17 = 5;
              goto LAB_0011aabe;
            }
            pbVar16 = pbVar16 + 1;
            is->src_ = (Ch *)pbVar16;
            while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
                  ) {
              pbVar16 = pbVar16 + 1;
            }
            is->src_ = (Ch *)pbVar16;
            ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar16 = (byte *)is->src_;
            while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
                  ) {
              pbVar16 = pbVar16 + 1;
            }
            is->src_ = (Ch *)pbVar16;
            SVar23 = SVar23 + 1;
            if (*pbVar16 != 0x2c) {
              if (*pbVar16 != 0x7d) {
                uVar17 = 6;
                goto LAB_0011aabe;
              }
              is->src_ = (Ch *)(pbVar16 + 1);
              bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndObject(handler,SVar23);
              if (bVar11) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                              ,0x313,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_0011aa6d;
            }
            pbVar16 = pbVar16 + 1;
            is->src_ = (Ch *)pbVar16;
            while (((ulong)*pbVar16 < 0x21 && ((0x100002600U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
                  ) {
              pbVar16 = pbVar16 + 1;
            }
            is->src_ = (Ch *)pbVar16;
          } while (*pbVar16 == 0x22);
        }
        uVar17 = 4;
      }
LAB_0011aabe:
      pCVar6 = is->head_;
      *(undefined4 *)(this + 0x30) = uVar17;
      *(long *)(this + 0x38) = (long)pbVar16 - (long)pCVar6;
    }
    return;
  }
  if (bVar2 == 0x74) {
    pcVar5 = is->src_;
    if (*pcVar5 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar18 = pcVar5 + 1;
    is->src_ = pcVar18;
    if (pcVar5[1] == 'r') {
      pcVar18 = pcVar5 + 2;
      is->src_ = pcVar18;
      if (pcVar5[2] == 'u') {
        pcVar18 = pcVar5 + 3;
        is->src_ = pcVar18;
        if (pcVar5[3] == 'e') {
          is->src_ = pcVar5 + 4;
          pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar15->data_).n = (Number)0x0;
          (pGVar15->data_).s.str = (Ch *)0x0;
          (pGVar15->data_).f.flags = 10;
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar6 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pcVar18 - (long)pCVar6;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x36c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (bVar2 == 0x6e) {
    ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar16 = pbVar3;
  bVar19 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar16 = pbVar3 + 1;
    bVar19 = pbVar3[1];
  }
  pCVar6 = is->head_;
  pCVar4 = is->dst_;
  if (bVar19 == 0x30) {
    uVar21 = (uint)pbVar16[1];
    pbVar24 = pbVar16 + 1;
    dVar8 = 0.0;
    bVar11 = false;
    uVar29 = 0;
    bVar10 = false;
    iVar12 = 0;
    bVar9 = false;
    uVar28 = 0;
    goto LAB_0010e7ee;
  }
  if ((byte)(bVar19 - 0x31) < 9) {
    uVar28 = bVar19 - 0x30;
    bVar19 = pbVar16[1];
    uVar22 = (ulong)bVar19;
    pbVar24 = pbVar16 + 1;
    dVar8 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar19 - 0x30) < 10) {
        iVar12 = 0;
LAB_0010e65f:
        if (uVar28 < 0xccccccc) {
LAB_0010e668:
          uVar28 = (uVar28 * 10 + (int)uVar22) - 0x30;
          iVar12 = iVar12 + 1;
          bVar19 = pbVar24[1];
          uVar22 = (ulong)bVar19;
          pbVar24 = pbVar24 + 1;
          if (9 < (byte)(bVar19 - 0x30)) goto LAB_0010e73e;
          goto LAB_0010e65f;
        }
        if (uVar28 != 0xccccccc) goto LAB_0010e6e0;
        if ((byte)uVar22 < 0x39) goto LAB_0010e668;
        uVar28 = 0xccccccc;
        uVar22 = 0x39;
LAB_0010e6e0:
        uVar29 = (ulong)uVar28;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar29) && (0x38 < (byte)uVar22 || uVar29 != 0xccccccccccccccc)
               ) goto LAB_0010e78d;
            uVar29 = (uVar22 & 0xf) + uVar29 * 10;
            iVar12 = iVar12 + 1;
            bVar19 = pbVar24[1];
            uVar22 = (ulong)bVar19;
            pbVar24 = pbVar24 + 1;
          } while ((byte)(bVar19 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar29) &&
               (0x35 < (byte)uVar22 || uVar29 != 0x1999999999999999)) goto LAB_0010e78d;
            uVar29 = (uVar22 & 0xf) + uVar29 * 10;
            iVar12 = iVar12 + 1;
            bVar19 = pbVar24[1];
            uVar22 = (ulong)bVar19;
            pbVar24 = pbVar24 + 1;
          } while ((byte)(bVar19 - 0x30) < 10);
        }
        uVar21 = (uint)bVar19;
        dVar8 = 0.0;
        bVar9 = true;
        bVar11 = false;
        bVar10 = false;
        goto LAB_0010e7ee;
      }
LAB_0010ecdc:
      iVar12 = 0;
    }
    else {
      if (9 < (byte)(bVar19 - 0x30)) goto LAB_0010ecdc;
      iVar12 = 0;
      do {
        if (0x19999998 < uVar28) {
          if (uVar28 != 0x19999999) goto LAB_0010e6e0;
          if (0x35 < (byte)uVar22) {
            uVar28 = 0x19999999;
            goto LAB_0010e6e0;
          }
        }
        uVar28 = (uVar28 * 10 + (int)uVar22) - 0x30;
        iVar12 = iVar12 + 1;
        bVar19 = pbVar24[1];
        uVar22 = (ulong)bVar19;
        pbVar24 = pbVar24 + 1;
      } while ((byte)(bVar19 - 0x30) < 10);
    }
LAB_0010e73e:
    uVar21 = (uint)bVar19;
    bVar11 = false;
    uVar29 = 0;
    bVar10 = false;
    bVar9 = false;
    goto LAB_0010e7ee;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar14 = (long)pbVar16 - (long)pCVar6;
  *(undefined4 *)(this + 0x30) = 3;
LAB_0010ea53:
  *(long *)(this + 0x38) = lVar14;
  goto LAB_0010ecbd;
LAB_0010ea1a:
  do {
    pbVar16 = pbVar24 + 1;
    pbVar24 = pbVar24 + 1;
  } while ((byte)(*pbVar16 - 0x30) < 10);
LAB_0010eac7:
  iVar12 = -iVar27;
  if (!bVar11) {
    iVar12 = iVar27;
  }
LAB_0010ead4:
  if (bVar10) goto LAB_0010ead9;
  pbVar16 = pbVar24;
  if (!bVar9) {
    if (bVar2 == 0x2d) {
      pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar15->data_).s.str = (Ch *)0x0;
      *(long *)&pGVar15->data_ = (long)(int)-uVar28;
      uVar20 = 0xb6;
      if ((int)uVar28 < 1) {
        uVar20 = 0x1f6;
      }
      (pGVar15->data_).f.flags = uVar20;
    }
    else {
      pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar15->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar15->data_ = uVar22;
      (pGVar15->data_).f.flags = (ushort)(-1 < (int)uVar28) << 5 | 0x1d6;
    }
    goto LAB_0010ecbd;
  }
  if (bVar2 != 0x2d) {
    pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar15->data_).s.str = (Ch *)0x0;
    *(ulong *)&pGVar15->data_ = uVar29;
    uVar25 = (ushort)((uVar29 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
    if (uVar29 >> 0x20 != 0) {
      uVar25 = (ushort)(-1 < (long)uVar29) << 7 | 0x116;
    }
    (pGVar15->data_).f.flags = uVar25;
    goto LAB_0010ecbd;
  }
  bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           ::Int64(handler,-uVar29);
  if (bVar11) goto LAB_0010ecbd;
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x6c3,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_0010ec7c:
  *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar6;
  pbVar16 = pbVar24;
  goto LAB_0010ecbd;
LAB_0010e78d:
  auVar31._8_4_ = (int)(uVar29 >> 0x20);
  auVar31._0_8_ = uVar29;
  auVar31._12_4_ = 0x45300000;
  dVar8 = (auVar31._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0);
  do {
    dVar8 = dVar8 * 10.0 + (double)((int)uVar22 + -0x30);
    bVar19 = pbVar24[1];
    uVar22 = (ulong)bVar19;
    uVar21 = (uint)bVar19;
    pbVar24 = pbVar24 + 1;
  } while ((byte)(bVar19 - 0x30) < 10);
  bVar11 = true;
  bVar10 = true;
  bVar9 = true;
LAB_0010e7ee:
  uVar22 = (ulong)uVar28;
  if ((char)uVar21 != '.') {
    iVar26 = 0;
LAB_0010e94e:
    iVar12 = 0;
    if ((uVar21 | 0x20) == 0x65) {
      uVar13 = uVar22;
      if (bVar9) {
        uVar13 = uVar29;
      }
      if (!bVar10) {
        auVar33._8_4_ = (int)(uVar13 >> 0x20);
        auVar33._0_8_ = uVar13;
        auVar33._12_4_ = 0x45300000;
        dVar8 = (auVar33._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
        bVar10 = true;
      }
      bVar19 = pbVar24[1];
      bVar11 = bVar19 != 0x2b;
      if ((bVar11) && (bVar19 != 0x2d)) {
        if (9 < (byte)(bVar19 - 0x30)) {
          pbVar16 = pbVar24 + 1;
LAB_0010ea30:
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                          ,0x67c,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar14 = (long)pbVar16 - (long)pCVar6;
          *(undefined4 *)(this + 0x30) = 0xf;
          goto LAB_0010ea53;
        }
        pbVar24 = pbVar24 + 2;
        iVar27 = bVar19 - 0x30;
      }
      else {
        pbVar16 = pbVar24 + 2;
        if (9 < (byte)(*pbVar16 - 0x30)) {
          pbVar16 = pbVar24 + 2;
          goto LAB_0010ea30;
        }
        pbVar24 = pbVar24 + 3;
        iVar27 = *pbVar16 - 0x30;
        if (bVar19 != 0x2b) {
          if (0 < iVar26) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                          ,0x667,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar19 = *pbVar24;
          if ((byte)(bVar19 - 0x30) < 10) {
            do {
              iVar27 = iVar27 * 10 + (uint)bVar19 + -0x30;
              if ((iVar26 + 0x7ffffff7) / 10 < iVar27) goto LAB_0010ea1a;
              pbVar24 = pbVar24 + 1;
              bVar19 = *pbVar24;
            } while ((byte)(bVar19 - 0x30) < 10);
          }
          else {
            bVar11 = true;
          }
          goto LAB_0010eac7;
        }
      }
      do {
        bVar19 = *pbVar24;
        if (9 < (byte)(bVar19 - 0x30)) {
          bVar11 = false;
          goto LAB_0010eac7;
        }
        pbVar24 = pbVar24 + 1;
        iVar27 = iVar27 * 10 + (uint)bVar19 + -0x30;
      } while (iVar27 <= 0x134 - iVar26);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x677,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar6;
      pbVar16 = pbVar24;
      goto LAB_0010ecbd;
    }
    goto LAB_0010ead4;
  }
  uVar21 = (uint)pbVar24[1];
  pbVar16 = pbVar24 + 1;
  if ((byte)(pbVar24[1] - 0x3a) < 0xf6) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x627,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xe;
    *(long *)(this + 0x38) = (long)pbVar16 - (long)pCVar6;
    goto LAB_0010ecbd;
  }
  iVar26 = 0;
  if (bVar11) {
LAB_0010e8a5:
    do {
      pbVar24 = pbVar16;
      if (0x39 < (byte)uVar21) goto LAB_0010e94e;
      if (iVar12 < 0x11) {
        dVar8 = dVar8 * 10.0 + (double)(int)(uVar21 - 0x30);
        iVar26 = iVar26 + -1;
        if (0.0 < dVar8) {
          iVar12 = iVar12 + 1;
        }
      }
      pbVar1 = pbVar16 + 1;
      uVar21 = (uint)*pbVar1;
      pbVar24 = pbVar16 + 1;
      pbVar16 = pbVar24;
    } while ('/' < (char)*pbVar1);
    iVar12 = 0;
    goto LAB_0010ead4;
  }
  if (!bVar9) {
    uVar29 = uVar22;
  }
  iVar26 = 0;
  do {
    if ((0x39 < (byte)uVar21) || (uVar29 >> 0x35 != 0)) {
      auVar32._8_4_ = (int)(uVar29 >> 0x20);
      auVar32._0_8_ = uVar29;
      auVar32._12_4_ = 0x45300000;
      dVar8 = (auVar32._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0);
      bVar10 = true;
      goto LAB_0010e8a5;
    }
    pbVar24 = pbVar16 + 1;
    iVar26 = iVar26 + -1;
    uVar29 = (ulong)(uVar21 - 0x30) + uVar29 * 10;
    iVar12 = iVar12 + (uint)(uVar29 != 0);
    pbVar1 = pbVar16 + 1;
    uVar21 = (uint)*pbVar1;
    pbVar16 = pbVar24;
  } while ('/' < (char)*pbVar1);
  dVar8 = (double)(long)uVar29;
  iVar12 = 0;
LAB_0010ead9:
  uVar28 = iVar12 + iVar26;
  if ((int)uVar28 < -0x134) {
    dVar30 = 0.0;
    if (0xfffffd97 < uVar28) {
      dVar30 = (dVar8 / 1e+308) /
               *(double *)(internal::Pow10(int)::e + (ulong)(-uVar28 - 0x134) * 8);
      goto LAB_0010ec58;
    }
  }
  else {
    if ((int)uVar28 < 0) {
      dVar30 = dVar8 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar28 * 8);
    }
    else {
      if (0x134 < uVar28) {
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      dVar30 = dVar8 * *(double *)(internal::Pow10(int)::e + (ulong)uVar28 * 8);
    }
LAB_0010ec58:
    if (1.79769313486232e+308 < dVar30) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x6ab,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_0010ec7c;
    }
  }
  pGVar15 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  uStack_48 = SUB84(dVar30,0);
  uStack_44 = (uint)((ulong)dVar30 >> 0x20);
  if (bVar2 == 0x2d) {
    uStack_44 = uStack_44 ^ 0x80000000;
  }
  (pGVar15->data_).s.str = (Ch *)0x216000000000000;
  NVar7.u64._4_4_ = uStack_44;
  NVar7.i.i = uStack_48;
  (pGVar15->data_).n = NVar7;
  pbVar16 = pbVar24;
LAB_0010ecbd:
  is->src_ = (Ch *)pbVar16;
  is->dst_ = pCVar4;
  is->head_ = pCVar6;
  return;
}

Assistant:

Ch Peek() { return *src_; }